

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O0

DeduplicateStatus __thiscall
cmCPackArchiveGenerator::Deduplicator::IsDeduplicate
          (Deduplicator *this,string *path,string *localTopLevel)

{
  bool bVar1;
  undefined4 local_24;
  DeduplicateStatus status;
  string *localTopLevel_local;
  string *path_local;
  Deduplicator *this_local;
  
  bVar1 = cmsys::SystemTools::FileIsDirectory(path);
  if (bVar1) {
    local_24 = CompareFolder(this,path);
  }
  else {
    bVar1 = cmsys::SystemTools::FileIsSymlink(path);
    if (bVar1) {
      local_24 = CompareSymlink(this,path);
    }
    else {
      local_24 = CompareFile(this,path,localTopLevel);
    }
  }
  return local_24;
}

Assistant:

DeduplicateStatus IsDeduplicate(const std::string& path,
                                  const std::string& localTopLevel)
  {
    DeduplicateStatus status;
    if (cmSystemTools::FileIsDirectory(path)) {
      status = this->CompareFolder(path);
    } else if (cmSystemTools::FileIsSymlink(path)) {
      status = this->CompareSymlink(path);
    } else {
      status = this->CompareFile(path, localTopLevel);
    }

    return status;
  }